

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Srm2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pName2;
  Gia_Rpr_t *__src;
  int *__src_00;
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Rpr_t *pGVar4;
  int *piVar5;
  Gia_Man_t *p;
  char *pcVar6;
  int fVerbose;
  int c;
  int fLatchB;
  int fLatchA;
  Gia_Man_t *pAux;
  Gia_Man_t *pTemp;
  char *pFileName2;
  char *pFileName1;
  char pFileName [10];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = 0;
  fVerbose = 0;
  bVar1 = false;
  pFileName._2_8_ = argv;
  Extra_UtilGetoptReset();
LAB_002523a2:
  iVar2 = Extra_UtilGetopt(argc,(char **)pFileName._2_8_,"abvh");
  if (iVar2 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Srm2(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else if ((pAbc->pGia->pReprs == (Gia_Rpr_t *)0x0) || (pAbc->pGia->pNexts == (int *)0x0)) {
      Abc_Print(-1,"Equivalences are not defined.\n");
      pAbc_local._4_4_ = 0;
    }
    else if (argc == globalUtilOptind + 2) {
      pcVar6 = *(char **)(pFileName._2_8_ + (long)globalUtilOptind * 8);
      pName2 = *(char **)(pFileName._2_8_ + (long)(globalUtilOptind + 1) * 8);
      sprintf((char *)((long)&pFileName1 + 6),"gsrm.aig");
      pGVar3 = Gia_ManDup(pAbc->pGia);
      iVar2 = Gia_ManObjNum(pGVar3);
      pGVar4 = (Gia_Rpr_t *)malloc((long)iVar2 << 2);
      pGVar3->pReprs = pGVar4;
      pGVar4 = pGVar3->pReprs;
      __src = pAbc->pGia->pReprs;
      iVar2 = Gia_ManObjNum(pGVar3);
      memcpy(pGVar4,__src,(long)iVar2 << 2);
      iVar2 = Gia_ManObjNum(pGVar3);
      piVar5 = (int *)malloc((long)iVar2 << 2);
      pGVar3->pNexts = piVar5;
      piVar5 = pGVar3->pNexts;
      __src_00 = pAbc->pGia->pNexts;
      iVar2 = Gia_ManObjNum(pGVar3);
      memcpy(piVar5,__src_00,(long)iVar2 << 2);
      iVar2 = Gia_ManFilterEquivsForSpeculation(pGVar3,pcVar6,pName2,c,fVerbose);
      if (iVar2 == 0) {
        Gia_ManStop(pGVar3);
        Abc_Print(-1,"Filtering equivalences has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        p = Gia_ManSpecReduce(pGVar3,0,0,1,0,0);
        Gia_ManStop(pGVar3);
        if (p != (Gia_Man_t *)0x0) {
          pGVar3 = Gia_ManSeqStructSweep(p,1,1,0);
          Gia_ManStop(p);
          Gia_AigerWrite(pGVar3,(char *)((long)&pFileName1 + 6),0,0);
          Abc_Print(1,"Speculatively reduced model was written into file \"%s\".\n",
                    (long)&pFileName1 + 6);
          Gia_ManPrintStatsShort(pGVar3);
          Gia_ManStop(pGVar3);
        }
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(-1,"Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n");
      pAbc_local._4_4_ = 1;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x61:
    c = c ^ 1;
    goto LAB_002523a2;
  case 0x62:
    fVerbose = fVerbose ^ 1;
    goto LAB_002523a2;
  default:
    break;
  case 0x68:
    break;
  case 0x76:
    goto switchD_002523e0_caseD_76;
  }
  Abc_Print(-2,"usage: &srm2 [-abvh] <PartA_FileName> <PartB_FileName>\n");
  Abc_Print(-2,"\t         writes speculatively reduced model into file \"%s\"\n",
            (long)&pFileName1 + 6);
  Abc_Print(-2,"\t         only preserves equivalences across PartA and PartB\n");
  pcVar6 = "no";
  if (c != 0) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle using latches only in PartA [default = %s]\n",pcVar6);
  pcVar6 = "no";
  if (fVerbose != 0) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-b     : toggle using latches only in PartB [default = %s]\n",pcVar6);
  pcVar6 = "no";
  if (bVar1) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002523e0_caseD_76:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_002523a2;
}

Assistant:

int Abc_CommandAbc9Srm2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char pFileName[10], * pFileName1, * pFileName2;
    Gia_Man_t * pTemp, * pAux;
    int fLatchA = 0, fLatchB = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "abvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fLatchA ^= 1;
            break;
        case 'b':
            fLatchB ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->pReprs == NULL || pAbc->pGia->pNexts == NULL )
    {
        Abc_Print( -1, "Equivalences are not defined.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n" );
        return 1;
    }
    // get the input file name
    pFileName1 = argv[globalUtilOptind];
    pFileName2 = argv[globalUtilOptind+1];
    // create file name
    sprintf(pFileName,  "gsrm.aig" );
    pTemp = Gia_ManDup( pAbc->pGia );
    // copy equivalences
    pTemp->pReprs = ABC_ALLOC( Gia_Rpr_t, Gia_ManObjNum(pTemp) );
    memcpy( pTemp->pReprs, pAbc->pGia->pReprs, sizeof(Gia_Rpr_t) * Gia_ManObjNum(pTemp) );
    pTemp->pNexts = ABC_ALLOC( int, Gia_ManObjNum(pTemp) );
    memcpy( pTemp->pNexts, pAbc->pGia->pNexts, sizeof(int) * Gia_ManObjNum(pTemp) );
//Gia_ManPrintStats( pTemp, 0 );
    // filter the classes
    if ( !Gia_ManFilterEquivsForSpeculation( pTemp, pFileName1, pFileName2, fLatchA, fLatchB ) )
    {
        Gia_ManStop( pTemp );
        Abc_Print( -1, "Filtering equivalences has failed.\n" );
        return 1;
    }
//Gia_ManPrintStats( pTemp, 0 );
    pTemp = Gia_ManSpecReduce( pAux = pTemp, 0, 0, 1, 0, 0 );
    Gia_ManStop( pAux );
    if ( pTemp )
    {
        pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
        Gia_ManStop( pAux );

        Gia_AigerWrite( pTemp, pFileName, 0, 0 );
        Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", pFileName );
        Gia_ManPrintStatsShort( pTemp );
        Gia_ManStop( pTemp );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &srm2 [-abvh] <PartA_FileName> <PartB_FileName>\n" );
    Abc_Print( -2, "\t         writes speculatively reduced model into file \"%s\"\n", pFileName );
    Abc_Print( -2, "\t         only preserves equivalences across PartA and PartB\n" );
    Abc_Print( -2, "\t-a     : toggle using latches only in PartA [default = %s]\n", fLatchA? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using latches only in PartB [default = %s]\n", fLatchB? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}